

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_go_to_time_for_bed(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  long lVar3;
  
  state->bell = '(';
  state->locked_doors[0] = 0x80;
  state->locked_doors[1] = 0x81;
  queue_message(state,message_TIME_FOR_BED);
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = 0x85;
    state->vischars[0].route.step = '\x02';
    set_route(state,state->vischars);
  }
  bVar2 = 0x85;
  lVar3 = 0;
  do {
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar3],(route_t)(bVar2 + 0x200)
                       );
    bVar2 = bVar2 + ((char)lVar3 == '\x04');
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\n');
  return;
}

Assistant:

static void event_go_to_time_for_bed(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;

  /* Lock the gates. */
  state->locked_doors[0] = 0 | door_LOCKED; /* Index into doors + set locked flag. */
  state->locked_doors[1] = 1 | door_LOCKED;

  queue_message(state, message_TIME_FOR_BED);
  go_to_time_for_bed(state);
}